

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

float __thiscall pbrt::SampledGrid<float>::Lookup(SampledGrid<float> *this,Point3i *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  
  uVar1 = this->nx;
  uVar2 = this->nz;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = uVar2;
  }
  iVar3 = (p->super_Tuple3<pbrt::Point3,_int>).x;
  fVar8 = 0.0;
  if (((int)((int)uVar1 >> 0x1f & uVar1) <= iVar3) && (iVar3 < (int)uVar6)) {
    uVar6 = this->ny;
    uVar7 = 0;
    if ((int)uVar6 < 0) {
      uVar7 = uVar6;
    }
    iVar4 = (p->super_Tuple3<pbrt::Point3,_int>).y;
    if (((((int)uVar7 <= iVar4) && (iVar4 < (int)(~((int)uVar6 >> 0x1f) & uVar6))) &&
        (iVar4 = (p->super_Tuple3<pbrt::Point3,_int>).z, (int)((int)uVar2 >> 0x1f & uVar2) <= iVar4)
        ) && (iVar4 < (int)uVar5)) {
      fVar8 = (this->values).ptr
              [(int)((uVar6 * (p->super_Tuple3<pbrt::Point3,_int>).z +
                     (p->super_Tuple3<pbrt::Point3,_int>).y) * uVar1 + iVar3)];
    }
  }
  return fVar8;
}

Assistant:

PBRT_CPU_GPU
    T Lookup(const Point3i &p) const {
        Bounds3i sampleBounds(Point3i(0, 0, 0), Point3i(nx, ny, nz));
        if (!InsideExclusive(p, sampleBounds))
            return {};
        return values[(p.z * ny + p.y) * nx + p.x];
    }